

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_constructor_test.h
# Opt level: O0

void phmap::priv::
     AllocTest<phmap::parallel_flat_hash_map<int,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>,4ul,std::mutex>>
               (void)

{
  _Head_base<0UL,_unsigned_long,_false> *this;
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_7c0;
  Message local_7b8;
  char local_7a9;
  undefined1 local_7a8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_778;
  Message local_770;
  bool local_761;
  undefined1 local_760 [8];
  AssertionResult gtest_ar_;
  Message local_748;
  undefined1 local_740 [8];
  undefined1 local_738 [8];
  AssertionResult gtest_ar;
  undefined1 local_718 [8];
  parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_std::mutex>
  m;
  A alloc;
  
  this = (_Head_base<0UL,_unsigned_long,_false> *)
         ((long)&m.
                 super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                 .
                 super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                 .sets_._M_elems[0xf].set_.settings_ + 0x18);
  Alloc<std::pair<const_int,_int>_>::Alloc((Alloc<std::pair<const_int,_int>_> *)this,0);
  parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_std::mutex>
  ::parallel_hash_set((parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_std::mutex>
                       *)local_718,(allocator_type *)this);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::get_allocator((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                   *)local_740);
  testing::internal::EqHelper::
  Compare<phmap::priv::Alloc<std::pair<const_int,_int>_>,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_nullptr>
            ((EqHelper *)local_738,"m.get_allocator()","alloc",
             (Alloc<std::pair<const_int,_int>_> *)local_740,
             (Alloc<std::pair<const_int,_int>_> *)
             ((long)&m.
                     super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                     .
                     super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                     .sets_._M_elems[0xf].set_.settings_ + 0x18));
  Alloc<std::pair<const_int,_int>_>::~Alloc((Alloc<std::pair<const_int,_int>_> *)local_740);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_738);
  if (!bVar1) {
    testing::Message::Message(&local_748);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_738);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0xaa,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_748);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_748);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_738);
  local_761 = parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
              ::empty((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                       *)local_718);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_760,&local_761,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_760);
  if (!bVar1) {
    testing::Message::Message(&local_770);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_760,(AssertionResult *)"m.empty()",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_778,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0xab,pcVar2);
    testing::internal::AssertHelper::operator=(&local_778,&local_770);
    testing::internal::AssertHelper::~AssertHelper(&local_778);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_770);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_760);
  testing::UnorderedElementsAre<>();
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<>>>();
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<>>>::
  operator()(local_7a8,&local_7a9,
             (parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_std::mutex>
              *)0x3bc78d);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7a8);
  if (!bVar1) {
    testing::Message::Message(&local_7b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_7c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0xac,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7c0,&local_7b8);
    testing::internal::AssertHelper::~AssertHelper(&local_7c0);
    testing::Message::~Message(&local_7b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7a8);
  parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_std::mutex>
  ::~parallel_flat_hash_map
            ((parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_std::mutex>
              *)local_718);
  Alloc<std::pair<const_int,_int>_>::~Alloc
            ((Alloc<std::pair<const_int,_int>_> *)
             ((long)&m.
                     super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                     .
                     super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                     .sets_._M_elems[0xf].set_.settings_ + 0x18));
  return;
}

Assistant:

void AllocTest(std::true_type) {
  using A = typename TypeParam::allocator_type;
  A alloc(0);
  TypeParam m(alloc);
  EXPECT_EQ(m.get_allocator(), alloc);
  EXPECT_TRUE(m.empty());
  EXPECT_THAT(m, ::testing::UnorderedElementsAre());
}